

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void * HACD::heap_malloc(HeapManager *hm,size_t size)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  if (size < 0x101) {
    pp_Var1 = hm[1]._vptr_HeapManager;
    pthread_mutex_lock((pthread_mutex_t *)(pp_Var1 + 2));
    pvVar2 = FixedMemory::allocate
                       ((FixedMemory *)pp_Var1[size + 10],(MicroChunkUpdate *)(pp_Var1 + 1));
    pthread_mutex_unlock((pthread_mutex_t *)(pp_Var1 + 2));
    return pvVar2;
  }
  pvVar2 = malloc(size);
  return pvVar2;
}

Assistant:

void * heap_malloc(HeapManager *hm,size_t size)
{
    return ((MyHeapManager *)hm)->inline_heap_malloc(size);
}